

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  uint __fd;
  int __fd_00;
  int iVar4;
  mode_t mode;
  byte bVar5;
  string real_destination;
  string destination_dir;
  ifstream fin;
  ofstream fout;
  string source_name;
  string local_1480;
  string local_1460;
  string local_1440;
  byte abStack_1420 [488];
  long local_1238;
  filebuf local_1230 [24];
  byte abStack_1218 [216];
  ios_base local_1140 [264];
  undefined1 local_1038 [4104];
  
  iVar3 = stat((source->_M_dataplus)._M_p,(stat *)local_1038);
  mode = 0;
  if (-1 < iVar3) {
    mode = local_1038._24_4_;
  }
  local_1480._M_dataplus._M_p = (pointer)&local_1480.field_2;
  pcVar1 = (destination->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1480,pcVar1,pcVar1 + destination->_M_string_length);
  bVar2 = FileIsDirectory(source);
  if (bVar2) {
    MakeDirectory(destination,(mode_t *)0x0);
  }
  else {
    local_1460._M_dataplus._M_p = (pointer)&local_1460.field_2;
    local_1460._M_string_length = 0;
    local_1460.field_2._M_local_buf[0] = '\0';
    bVar2 = FileIsDirectory(destination);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_1460);
      ConvertToUnixSlashes(&local_1480);
      std::__cxx11::string::push_back((char)&local_1480);
      pcVar1 = (source->_M_dataplus)._M_p;
      local_1038._0_8_ = local_1038 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1038,pcVar1,pcVar1 + source->_M_string_length);
      GetFilenameName(&local_1440,(string *)local_1038);
      std::__cxx11::string::_M_append((char *)&local_1480,(ulong)local_1440._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1440._M_dataplus._M_p != &local_1440.field_2) {
        operator_delete(local_1440._M_dataplus._M_p,local_1440.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
LAB_003db70c:
        operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
      }
    }
    else {
      GetFilenamePath((string *)local_1038,destination);
      std::__cxx11::string::operator=((string *)&local_1460,(string *)local_1038);
      if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) goto LAB_003db70c;
    }
    bVar2 = SameFile(source,&local_1480);
    if (bVar2) {
      bVar5 = 1;
LAB_003db90b:
      bVar2 = false;
    }
    else {
      MakeDirectory(&local_1460,(mode_t *)0x0);
      __fd = open((source->_M_dataplus)._M_p,0);
      if ((int)__fd < 0) {
LAB_003db7b5:
        std::ifstream::ifstream(&local_1440,(source->_M_dataplus)._M_p,_S_in|_S_bin);
        if ((abStack_1420[*(long *)(local_1440._M_dataplus._M_p + -0x18)] & 5) == 0) {
          RemoveFile(&local_1480);
          std::ofstream::ofstream(&local_1238,local_1480._M_dataplus._M_p,_S_trunc|_S_out|_S_bin);
          if ((abStack_1218[*(long *)(local_1238 + -0x18)] & 5) == 0) {
            if ((abStack_1420[*(long *)(local_1440._M_dataplus._M_p + -0x18)] & 5) == 0) {
              do {
                std::istream::read((char *)&local_1440,(long)local_1038);
                if (local_1440._M_string_length == 0) break;
                std::ostream::write((char *)&local_1238,(long)local_1038);
              } while ((abStack_1420[*(long *)(local_1440._M_dataplus._M_p + -0x18)] & 5) == 0);
            }
            std::ostream::flush();
            std::ifstream::close();
            std::ofstream::close();
            source = (string *)(ulong)((abStack_1218[*(long *)(local_1238 + -0x18)] & 5) == 0);
          }
          else {
            source = (string *)0x0;
          }
          local_1238 = _VTT;
          *(undefined8 *)(local_1230 + *(long *)(_VTT + -0x18) + -8) =
               _SSL_CTX_load_verify_locations;
          std::filebuf::~filebuf(local_1230);
          std::ios_base::~ios_base(local_1140);
          std::ifstream::~ifstream(&local_1440);
          if ((char)source != '\0') goto LAB_003db903;
        }
        else {
          std::ifstream::~ifstream(&local_1440);
        }
        bVar5 = 0;
        goto LAB_003db90b;
      }
      RemoveFile(&local_1480);
      __fd_00 = open(local_1480._M_dataplus._M_p,0x241,0x180);
      if (__fd_00 < 0) {
        close(__fd);
        goto LAB_003db7b5;
      }
      iVar4 = ioctl(__fd_00,0x40049409,(ulong)__fd);
      close(__fd);
      close(__fd_00);
      if (iVar4 < 0) goto LAB_003db7b5;
LAB_003db903:
      bVar5 = (byte)source;
      bVar2 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1460._M_dataplus._M_p != &local_1460.field_2) {
      operator_delete(local_1460._M_dataplus._M_p,
                      CONCAT71(local_1460.field_2._M_allocated_capacity._1_7_,
                               local_1460.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar2) goto LAB_003db94b;
  }
  if (-1 < iVar3) {
    bVar5 = 0;
    bVar2 = SetPermissions(&local_1480,mode,false);
    if (!bVar2) goto LAB_003db94b;
  }
  bVar5 = 1;
LAB_003db94b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1480._M_dataplus._M_p != &local_1480.field_2) {
    operator_delete(local_1480._M_dataplus._M_p,local_1480.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool SystemTools::CopyFileAlways(const std::string& source,
                                 const std::string& destination)
{
  mode_t perm = 0;
  bool perms = SystemTools::GetPermissions(source, perm);
  std::string real_destination = destination;

  if (SystemTools::FileIsDirectory(source)) {
    SystemTools::MakeDirectory(destination);
  } else {
    // If destination is a directory, try to create a file with the same
    // name as the source in that directory.

    std::string destination_dir;
    if (SystemTools::FileIsDirectory(destination)) {
      destination_dir = real_destination;
      SystemTools::ConvertToUnixSlashes(real_destination);
      real_destination += '/';
      std::string source_name = source;
      real_destination += SystemTools::GetFilenameName(source_name);
    } else {
      destination_dir = SystemTools::GetFilenamePath(destination);
    }
    // If files are the same do not copy
    if (SystemTools::SameFile(source, real_destination)) {
      return true;
    }

    // Create destination directory

    SystemTools::MakeDirectory(destination_dir);

    if (!CloneFileContent(source, real_destination)) {
      // if cloning did not succeed, fall back to blockwise copy
      if (!CopyFileContentBlockwise(source, real_destination)) {
        return false;
      }
    }
  }
  if (perms) {
    if (!SystemTools::SetPermissions(real_destination, perm)) {
      return false;
    }
  }
  return true;
}